

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void return_example(vw *all,example *ec)

{
  bool holdout_set_off;
  int *piVar1;
  shared_data *this;
  size_t current_pass;
  int *piVar2;
  allocator local_51;
  string local_50;
  
  shared_data::update(all->sd,ec->test_only,true,ec->loss,ec->weight,ec->num_features);
  piVar1 = (all->final_prediction_sink)._end;
  for (piVar2 = (all->final_prediction_sink)._begin; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    MWT::print_scalars(*piVar2,&(ec->pred).scalars,&ec->tag);
  }
  this = all->sd;
  if (((double)this->dump_interval <=
       this->weighted_labeled_examples + this->weighted_unlabeled_examples) && (all->quiet == false)
     ) {
    holdout_set_off = all->holdout_set_off;
    current_pass = all->current_pass;
    std::__cxx11::string::string((string *)&local_50,"none",&local_51);
    shared_data::print_update
              (this,holdout_set_off,current_pass,&local_50,0,ec->num_features,all->progress_add,
               all->progress_arg);
    std::__cxx11::string::~string((string *)&local_50);
  }
  VW::finish_example(all,ec);
  return;
}

Assistant:

void return_example(vw &all, example &ec)
{
  all.sd->update(ec.test_only, true, ec.loss, ec.weight, ec.num_features);
  for (int f : all.final_prediction_sink) MWT::print_scalars(f, ec.pred.scalars, ec.tag);

  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet)
    all.sd->print_update(
        all.holdout_set_off, all.current_pass, "none", 0, ec.num_features, all.progress_add, all.progress_arg);
  VW::finish_example(all, ec);
}